

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg,string *config,
          string *lang,cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  bool bVar1;
  __type _Var2;
  string *psVar3;
  ostream *poVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  string outputFileName;
  string local_2b8;
  string rawCondition;
  cmGeneratedFileStream fout;
  
  std::__cxx11::string::string
            ((string *)&rawCondition,
             (string *)
             &((this->Condition)._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->Input);
  if (rawCondition._M_string_length == 0) {
LAB_00298625:
    psVar3 = cmCompiledGeneratorExpression::Evaluate
                       ((this->OutputFileExpr)._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,lang);
    std::__cxx11::string::string((string *)&outputFileName,(string *)psVar3);
    psVar3 = cmCompiledGeneratorExpression::Evaluate
                       (inputExpression,lg,config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,lang);
    bVar1 = cmsys::SystemTools::FileIsFullPath(&outputFileName);
    if (bVar1) {
      cmsys::SystemTools::CollapseFullPath((string *)&fout,&outputFileName);
    }
    else {
      FixRelativePath((string *)&fout,this,&outputFileName,PathForOutput,lg);
    }
    std::__cxx11::string::operator=((string *)&outputFileName,(string *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&outputFiles->_M_t,&outputFileName);
    if ((_Rb_tree_header *)iVar5._M_node == &(outputFiles->_M_t)._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lg->Makefile->OutputFiles,&outputFileName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Files,&outputFileName);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](outputFiles,&outputFileName);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      cmGeneratedFileStream::cmGeneratedFileStream(&fout,&outputFileName,false,None);
      cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
      std::operator<<((ostream *)&fout,(string *)psVar3);
      bVar1 = cmGeneratedFileStream::Close(&fout);
      if (bVar1 && perm != 0) {
        cmsys::SystemTools::SetPermissions(outputFileName._M_dataplus._M_p,perm,false);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
      goto LAB_0029881c;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (iVar5._M_node + 2),psVar3);
    if (_Var2) goto LAB_0029881c;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
    poVar4 = std::operator<<((ostream *)&fout,
                             "Evaluation file to be written multiple times with different content. This is generally caused by the content evaluating the configuration type, language, or location of object files:\n "
                            );
    std::operator<<(poVar4,(string *)&outputFileName);
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&local_2b8);
  }
  else {
    psVar3 = cmCompiledGeneratorExpression::Evaluate
                       ((this->Condition)._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,lang);
    std::__cxx11::string::string((string *)&outputFileName,(string *)psVar3);
    bVar1 = std::operator==(&outputFileName,"0");
    if (bVar1) goto LAB_0029881c;
    bVar1 = std::operator!=(&outputFileName,"1");
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&outputFileName);
      goto LAB_00298625;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
    poVar4 = std::operator<<((ostream *)&fout,"Evaluation file condition \"");
    poVar4 = std::operator<<(poVar4,(string *)&rawCondition);
    poVar4 = std::operator<<(poVar4,"\" did not evaluate to valid content. Got \"");
    poVar4 = std::operator<<(poVar4,(string *)&outputFileName);
    std::operator<<(poVar4,"\".");
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&local_2b8);
  }
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
LAB_0029881c:
  std::__cxx11::string::~string((string *)&outputFileName);
  std::__cxx11::string::~string((string *)&rawCondition);
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(
  cmLocalGenerator* lg, const std::string& config, const std::string& lang,
  cmCompiledGeneratorExpression* inputExpression,
  std::map<std::string, std::string>& outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  if (!rawCondition.empty()) {
    std::string condResult = this->Condition->Evaluate(
      lg, config, false, nullptr, nullptr, nullptr, lang);
    if (condResult == "0") {
      return;
    }
    if (condResult != "1") {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition
        << "\" did "
           "not evaluate to valid content. Got \""
        << condResult << "\".";
      lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  std::string outputFileName = this->OutputFileExpr->Evaluate(
    lg, config, false, nullptr, nullptr, nullptr, lang);
  const std::string& outputContent = inputExpression->Evaluate(
    lg, config, false, nullptr, nullptr, nullptr, lang);

  if (cmSystemTools::FileIsFullPath(outputFileName)) {
    outputFileName = cmSystemTools::CollapseFullPath(outputFileName);
  } else {
    outputFileName = this->FixRelativePath(outputFileName, PathForOutput, lg);
  }

  std::map<std::string, std::string>::iterator it =
    outputFiles.find(outputFileName);

  if (it != outputFiles.end()) {
    if (it->second == outputContent) {
      return;
    }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times with different "
         "content. "
         "This is generally caused by the content evaluating the "
         "configuration type, language, or location of object files:\n "
      << outputFileName;
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  lg->GetMakefile()->AddCMakeOutputFile(outputFileName);
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  cmGeneratedFileStream fout(outputFileName);
  fout.SetCopyIfDifferent(true);
  fout << outputContent;
  if (fout.Close() && perm) {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
  }
}